

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void check_newlinechar(compiler_common *common,int nltype,jump_list **backtracks,BOOL jumpifmatch)

{
  sljit_compiler *compiler_00;
  sljit_jump *psVar1;
  sljit_jump *jump_00;
  sljit_label *label;
  sljit_jump *jump;
  sljit_compiler *compiler;
  BOOL jumpifmatch_local;
  jump_list **backtracks_local;
  int nltype_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  if (nltype == 1) {
    psVar1 = sljit_emit_jump(compiler_00,0x19);
    add_jump(compiler_00,&common->anynewline,psVar1);
    sljit_set_current_flags(compiler_00,0x200);
    psVar1 = sljit_emit_jump(compiler_00,(uint)(jumpifmatch != 0));
    add_jump(compiler_00,backtracks,psVar1);
  }
  else if (nltype == 2) {
    if (jumpifmatch == 0) {
      psVar1 = sljit_emit_cmp(compiler_00,0,1,0,0x40,0xd);
      jump_00 = sljit_emit_cmp(compiler_00,1,1,0,0x40,10);
      add_jump(compiler_00,backtracks,jump_00);
      label = sljit_emit_label(compiler_00);
      sljit_set_label(psVar1,label);
    }
    else {
      psVar1 = sljit_emit_cmp(compiler_00,0,1,0,0x40,0xd);
      add_jump(compiler_00,backtracks,psVar1);
      psVar1 = sljit_emit_cmp(compiler_00,0,1,0,0x40,10);
      add_jump(compiler_00,backtracks,psVar1);
    }
  }
  else {
    psVar1 = sljit_emit_cmp(compiler_00,(uint)(jumpifmatch == 0),1,0,0x40,(long)common->newline);
    add_jump(compiler_00,backtracks,psVar1);
  }
  return;
}

Assistant:

static void check_newlinechar(compiler_common *common, int nltype, jump_list **backtracks, BOOL jumpifmatch)
{
/* Character comes in TMP1. Checks if it is a newline. TMP2 may be destroyed. */
DEFINE_COMPILER;
struct sljit_jump *jump;

if (nltype == NLTYPE_ANY)
  {
  add_jump(compiler, &common->anynewline, JUMP(SLJIT_FAST_CALL));
  sljit_set_current_flags(compiler, SLJIT_SET_Z);
  add_jump(compiler, backtracks, JUMP(jumpifmatch ? SLJIT_NOT_ZERO : SLJIT_ZERO));
  }
else if (nltype == NLTYPE_ANYCRLF)
  {
  if (jumpifmatch)
    {
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR));
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL));
    }
  else
    {
    jump = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_CR);
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, CHAR_NL));
    JUMPHERE(jump);
    }
  }
else
  {
  SLJIT_ASSERT(nltype == NLTYPE_FIXED && common->newline < 256);
  add_jump(compiler, backtracks, CMP(jumpifmatch ? SLJIT_EQUAL : SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, common->newline));
  }
}